

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

int __thiscall jpge::cfile_stream::open(cfile_stream *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  char *pFilename_local;
  cfile_stream *this_local;
  
  close(this,(int)__file);
  pFVar1 = fopen(__file,"wb");
  this->m_pFile = (FILE *)pFVar1;
  this->m_bStatus = this->m_pFile != (FILE *)0x0;
  return (uint)CONCAT71((int7)((ulong)this >> 8),this->m_bStatus) & 0xffffff01;
}

Assistant:

bool open(const char* pFilename)
		{
			close();
			m_pFile = fopen(pFilename, "wb");
			m_bStatus = (m_pFile != NULL);
			return m_bStatus;
		}